

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O0

void __thiscall
sznet::detail::ThreadNameInitializer::ThreadNameInitializer(ThreadNameInitializer *this)

{
  sz_pid_t sVar1;
  undefined8 *puVar2;
  ThreadNameInitializer *this_local;
  
  this->m_mainPid = 0;
  puVar2 = (undefined8 *)CurrentThread::t_threadName();
  *puVar2 = "main";
  sVar1 = CurrentThread::tid();
  this->m_mainPid = sVar1;
  return;
}

Assistant:

ThreadNameInitializer()
	{
		// 设置主线程名称
		sznet::CurrentThread::t_threadName = "main";
		// 缓存线程id
		m_mainPid = CurrentThread::tid();
	}